

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O1

void __thiscall PGSStreamReader::intDecodeStream(PGSStreamReader *this,uint8_t *buffer,size_t len)

{
  uint8_t uVar1;
  bool bVar2;
  uint16_t uVar3;
  uint8_t *end;
  BitStreamReader bitReader;
  BitStreamReader local_50;
  
  end = buffer + len;
  do {
    if (end <= buffer) {
      return;
    }
    if ((long)end - (long)buffer < 10) {
      return;
    }
    if (*buffer == '\0') {
      if (((buffer[1] == '\0') && (buffer[2] == '\x01')) &&
         (buffer = buffer + (byte)(buffer[8] + 9), end <= buffer)) {
        return;
      }
    }
    else if ((*buffer == 'P') && (buffer[1] == 'G')) {
      buffer = buffer + 10;
    }
    uVar1 = *buffer;
    uVar3 = AV_RB16(buffer + 1);
    if ((long)end - (long)buffer < (long)((ulong)uVar3 + 3)) {
      bVar2 = false;
    }
    else {
      buffer = buffer + 3;
      if (uVar1 == '\x16') {
        bVar2 = false;
        local_50.super_BitStream.m_totalBits = 0;
        local_50.super_BitStream.m_buffer = (uint *)0x0;
        local_50.super_BitStream.m_initBuffer = (uint *)0x0;
        local_50.m_curVal = 0;
        local_50.m_bitLeft = 0;
        BitStream::setBuffer(&local_50.super_BitStream,buffer,end);
        local_50._24_8_ = local_50._24_8_ & 0xffffffff;
        local_50.m_curVal = BitStreamReader::getCurVal(&local_50,local_50.super_BitStream.m_buffer);
        local_50.m_bitLeft = 0x20;
        video_descriptor(this,&local_50);
      }
      else {
        buffer = buffer + uVar3;
        bVar2 = true;
      }
    }
  } while (bVar2);
  return;
}

Assistant:

void PGSStreamReader::intDecodeStream(uint8_t* buffer, const size_t len)
{
    const uint8_t* bufEnd = buffer + len;
    uint8_t* curPos = buffer;
    while (curPos < bufEnd)
    {
        if (bufEnd - curPos < 10)
            return;
        if (curPos[0] == 'P' && curPos[1] == 'G')
            curPos += 10;
        else if (curPos[0] == 0 && curPos[1] == 0 && curPos[2] == 1)
        {
            const auto pesPacket = reinterpret_cast<PESPacket*>(curPos);
            curPos += pesPacket->getHeaderLength();
            if (curPos >= bufEnd)
                return;
        }

        const uint8_t segment_type = *curPos;
        const auto segment_len = AV_RB16(curPos + 1);
        if (bufEnd - curPos < 3ll + segment_len)
            return;

        curPos += 3;
        if (segment_type == 0x16)
        {
            BitStreamReader bitReader{};
            bitReader.setBuffer(curPos, bufEnd);
            video_descriptor(bitReader);
            return;
        }
        curPos += segment_len;
    }
}